

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_closure(JSContext *ctx,JSValue bfunc,JSVarRef **cur_var_refs,JSStackFrame *sf)

{
  ushort uVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSAtom name;
  ulong uVar5;
  long lVar6;
  JSValueUnion b;
  ulong uVar7;
  JSValue proto_val;
  JSValue JVar8;
  JSValue JVar9;
  JSValueUnion local_30;
  
  b = bfunc.u;
  uVar1 = *(ushort *)
           ((long)func_kind_to_class_id + (ulong)(*(ushort *)((long)b.ptr + 0x19) >> 3 & 6));
  JVar8.tag = ctx->class_proto[uVar1].tag;
  JVar8.u.ptr = ctx->class_proto[uVar1].u.ptr;
  JVar8 = JS_NewObjectProtoClass(ctx,JVar8,(uint)uVar1);
  if ((int)JVar8.tag != 6) {
    bfunc = js_closure2(ctx,JVar8,(JSFunctionBytecode *)b.ptr,cur_var_refs,sf);
    uVar7 = bfunc.tag;
    JVar3 = bfunc.u;
    if ((uVar7 & 0xffffffff) != 6) {
      name = 0x2f;
      if (*(JSAtom *)((long)b.ptr + 0x2c) != 0) {
        name = *(JSAtom *)((long)b.ptr + 0x2c);
      }
      js_function_set_properties(ctx,bfunc,name,(uint)*(uint16_t *)((long)b.ptr + 0x44));
      uVar1 = *(ushort *)((long)b.ptr + 0x19);
      if ((uVar1 & 0x10) == 0) {
        if ((uVar1 & 1) != 0) {
          if ((int)bfunc.tag == -1) {
            *(byte *)((long)JVar3.ptr + 5U) = *(byte *)((long)JVar3.ptr + 5U) | 0x10;
          }
          JS_DefineAutoInitProperty(ctx,bfunc,0x3b,JS_AUTOINIT_ID_PROTOTYPE,(void *)0x0,2);
        }
      }
      else {
        lVar6 = 0x280;
        if ((~uVar1 & 0x30) == 0) {
          lVar6 = 800;
        }
        proto_val.tag = *(int64_t *)((long)&ctx->class_proto->tag + lVar6);
        proto_val.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + lVar6))->ptr;
        JVar8 = JS_NewObjectProtoClass(ctx,proto_val,1);
        if ((int)JVar8.tag == 6) goto LAB_00139371;
        JS_DefinePropertyValue(ctx,bfunc,0x3b,JVar8,2);
      }
      uVar5 = (ulong)JVar3.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar3.ptr & 0xffffffff;
      goto LAB_001393a3;
    }
  }
LAB_00139371:
  local_30 = bfunc.u;
  if ((0xfffffff4 < (uint)bfunc.tag) &&
     (iVar2 = *local_30.ptr, *(int *)local_30.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,bfunc);
  }
  uVar7 = 6;
  uVar4 = 0;
  uVar5 = 0;
LAB_001393a3:
  JVar9.u.ptr = (void *)(uVar4 | uVar5);
  JVar9.tag = uVar7;
  return JVar9;
}

Assistant:

static JSValue js_closure(JSContext *ctx, JSValue bfunc,
                          JSVarRef **cur_var_refs,
                          JSStackFrame *sf)
{
    JSFunctionBytecode *b;
    JSValue func_obj;
    JSAtom name_atom;

    b = JS_VALUE_GET_PTR(bfunc);
    func_obj = JS_NewObjectClass(ctx, func_kind_to_class_id[b->func_kind]);
    if (JS_IsException(func_obj)) {
        JS_FreeValue(ctx, bfunc);
        return JS_EXCEPTION;
    }
    func_obj = js_closure2(ctx, func_obj, b, cur_var_refs, sf);
    if (JS_IsException(func_obj)) {
        /* bfunc has been freed */
        goto fail;
    }
    name_atom = b->func_name;
    if (name_atom == JS_ATOM_NULL)
        name_atom = JS_ATOM_empty_string;
    js_function_set_properties(ctx, func_obj, name_atom,
                               b->defined_arg_count);

    if (b->func_kind & JS_FUNC_GENERATOR) {
        JSValue proto;
        int proto_class_id;
        /* generators have a prototype field which is used as
           prototype for the generator object */
        if (b->func_kind == JS_FUNC_ASYNC_GENERATOR)
            proto_class_id = JS_CLASS_ASYNC_GENERATOR;
        else
            proto_class_id = JS_CLASS_GENERATOR;
        proto = JS_NewObjectProto(ctx, ctx->class_proto[proto_class_id]);
        if (JS_IsException(proto))
            goto fail;
        JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_prototype, proto,
                               JS_PROP_WRITABLE);
    } else if (b->has_prototype) {
        /* add the 'prototype' property: delay instantiation to avoid
           creating cycles for every javascript function. The prototype
           object is created on the fly when first accessed */
        JS_SetConstructorBit(ctx, func_obj, TRUE);
        JS_DefineAutoInitProperty(ctx, func_obj, JS_ATOM_prototype,
                                  JS_AUTOINIT_ID_PROTOTYPE, NULL,
                                  JS_PROP_WRITABLE);
    }
    return func_obj;
 fail:
    /* bfunc is freed when func_obj is freed */
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}